

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

void __thiscall GGSock::Communicator::Data::doRead(Data *this)

{
  TSocketDescriptor *sock;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  _Any_data *p_Var4;
  mapped_type *this_00;
  uint uVar5;
  size_t __n;
  uint uVar6;
  TMessageType local_42;
  pointer local_40;
  uint local_34;
  
  sock = &this->sdpeer;
  sVar2 = recv(this->sdpeer,&this->bufferHeaderRecv,6,0);
  iVar1 = (int)sVar2;
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      return;
    }
    this->isConnected = false;
    anon_unknown.dwarf_783c::closeAndReset(sock);
    anon_unknown.dwarf_783c::closeAndReset(&this->sd);
    if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return;
    }
    local_40 = (pointer)CONCAT62(local_40._2_6_,(short)*piVar3);
  }
  else {
    if (iVar1 == 6) {
      uVar6 = *(uint *)(this->bufferHeaderRecv)._M_elems;
      local_42 = *(TMessageType *)((this->bufferHeaderRecv)._M_elems + 4);
      if (uVar6 == 6) {
        p_Var4 = (_Any_data *)
                 std::
                 map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                 ::operator[](&this->messageCallback,&local_42);
        if (*(long *)(p_Var4 + 1) == 0) {
          return;
        }
        local_40 = (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_34 = 0;
        (**(code **)((long)p_Var4 + 0x18))(p_Var4,&local_40,&local_34);
        return;
      }
      if (uVar6 < 7) {
        return;
      }
      this->lastMessageType = local_42;
      uVar6 = uVar6 - 6;
      this->leftToReceive = uVar6;
      this->offsetReceive = 0;
      uVar5 = uVar6;
      if (*(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start < (int)uVar6) {
        printf("Extend receive buffer to %d bytes\n");
        std::vector<char,_std::allocator<char>_>::resize
                  (&this->bufferDataRecv,(long)this->leftToReceive);
        uVar5 = this->leftToReceive;
      }
joined_r0x0010b985:
      do {
        if ((int)uVar5 < 1) {
LAB_0010b9e0:
          this_00 = std::
                    map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                    ::operator[](&this->messageCallback,&local_42);
          if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0) {
            return;
          }
          std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator()
                    (this_00,(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start,uVar6);
          return;
        }
        __n = (size_t)uVar5;
        if (0xffff < uVar5) {
          __n = 0x10000;
        }
        sVar2 = recv(this->sdpeer,
                     (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + this->offsetReceive,__n,0);
        iVar1 = (int)sVar2;
        if (iVar1 < 0) {
          piVar3 = __errno_location();
          if (*piVar3 != 0xb) {
            this->isConnected = false;
            anon_unknown.dwarf_783c::closeAndReset(sock);
            anon_unknown.dwarf_783c::closeAndReset(&this->sd);
            if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
              local_40 = (pointer)CONCAT62(local_40._2_6_,(short)*piVar3);
              (*(this->errorCallback)._M_invoker)
                        ((_Any_data *)&this->errorCallback,(short *)&local_40);
            }
            goto LAB_0010b9e0;
          }
          uVar5 = this->leftToReceive;
          goto joined_r0x0010b985;
        }
        if (iVar1 == 0) goto LAB_0010b83c;
        uVar5 = this->leftToReceive - iVar1;
        this->leftToReceive = uVar5;
        this->offsetReceive = this->offsetReceive + iVar1;
      } while( true );
    }
    if (iVar1 != 0) {
      return;
    }
LAB_0010b83c:
    this->isListening = false;
    this->isConnected = false;
    anon_unknown.dwarf_783c::closeAndReset(sock);
    anon_unknown.dwarf_783c::closeAndReset(&this->sd);
    if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return;
    }
    piVar3 = __errno_location();
    local_40 = (pointer)CONCAT62(local_40._2_6_,(short)*piVar3);
  }
  (*(this->errorCallback)._M_invoker)((_Any_data *)&this->errorCallback,(short *)&local_40);
  return;
}

Assistant:

void doRead() {
            int rc = (int) recv(sdpeer, bufferHeaderRecv.data(), bufferHeaderRecv.size(), 0);
            if (rc < 0) {
                if (e_wouldBlock() == false) {
                    isConnected = false;
                    ::closeAndReset(sdpeer);
                    ::closeAndReset(sd);

                    TErrorCode errorCode = errno;
                    if (errorCallback) {
                        errorCallback(errorCode);
                    }
                }
                return;
            }

            if (rc == 0) {
                isConnected = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);

                TErrorCode errorCode = errno;
                if (errorCallback) {
                    errorCallback(errorCode);
                }

                return;
            }

            //printf("  %d bytes received, %d %d\n", rc,
            //       (int)(*reinterpret_cast<int32_t *>(bufferHeaderRecv.data())),
            //       (int)(*reinterpret_cast<int16_t *>(bufferHeaderRecv.data() + sizeof(int32_t)))
            //       );

            if (rc == (int) bufferHeaderRecv.size()) {
                TBufferSize size = 0;
                TMessageType type = 0;
                memcpy(&size, bufferHeaderRecv.data(), sizeof(size));
                memcpy(&type, bufferHeaderRecv.data() + sizeof(size), sizeof(type));
                if (size == ::MessageHeader::getSizeInBytes()) {
                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), 0);
                    }
                } else if (size > ::MessageHeader::getSizeInBytes()) {
                    lastMessageType = type;
                    leftToReceive = size - ::MessageHeader::getSizeInBytes();
                    offsetReceive = 0;
                    if (leftToReceive > (int) bufferDataRecv.size()) {
                        printf("Extend receive buffer to %d bytes\n", (int) bufferDataRecv.size());
                        bufferDataRecv.resize(leftToReceive);
                    }

                    while (leftToReceive > 0) {
                        //printf("left = %d\n", (int) leftToReceive);
                        size_t curSize = (std::min)(65536, (int) leftToReceive);

                        int rc = (int) recv(sdpeer, bufferDataRecv.data() + offsetReceive, curSize, 0);
                        if (rc < 0) {
                            if (e_wouldBlock() == false) {
                                isConnected = false;
                                ::closeAndReset(sdpeer);
                                ::closeAndReset(sd);

                                if (errorCallback) {
                                    TErrorCode errorCode = errno;
                                    errorCallback(errorCode);
                                }

                                break;
                            }

                            continue;
                        }

                        if (rc == 0) {
                            isConnected = false;
                            isListening = false;
                            ::closeAndReset(sdpeer);
                            ::closeAndReset(sd);

                            TErrorCode errorCode = errno;
                            if (errorCallback) errorCallback(errorCode);

                            return;
                        }

                        leftToReceive -= rc;
                        offsetReceive += rc;
                    }

                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), size - ::MessageHeader::getSizeInBytes());
                    }
                } else {
                    // error
                }
            }
        }